

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O3

float Abc_SclCountNonBufferLoadInt(SC_Man *p,Abc_Obj_t *pObj)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  void *pvVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  
  fVar7 = 0.0;
  if (((*(uint *)&pObj->field_0x14 & 0xf) != 7) || ((pObj->vFanins).nSize != 1)) {
    return 0.0;
  }
  if ((pObj->vFanouts).nSize < 1) {
    fVar7 = 0.0;
  }
  else {
    lVar5 = 0;
    do {
      fVar6 = Abc_SclCountNonBufferLoadInt
                        (p,(Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar5]]);
      fVar7 = fVar7 + fVar6;
      lVar5 = lVar5 + 1;
    } while (lVar5 < (pObj->vFanouts).nSize);
  }
  uVar1 = pObj->Id;
  if (-1 < (int)uVar1) {
    pVVar3 = pObj->pNtk->vGates;
    if ((int)uVar1 < pVVar3->nSize) {
      uVar2 = pVVar3->pArray[uVar1];
      if (((((ulong)uVar2 != 0xffffffff) && (-1 < (int)uVar2)) &&
          (pvVar4 = pObj->pNtk->pSCLib, (int)uVar2 < *(int *)((long)pvVar4 + 100))) &&
         (lVar5 = *(long *)(*(long *)((long)pvVar4 + 0x68) + (ulong)uVar2 * 8),
         0 < *(int *)(lVar5 + 0x34))) {
        lVar5 = **(long **)(lVar5 + 0x38);
        return (p->pLoads[uVar1].rise * 0.5 + p->pLoads[uVar1].fall * 0.5 + fVar7) -
               (*(float *)(lVar5 + 0x10) * 0.5 + *(float *)(lVar5 + 0x14) * 0.5);
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

float Abc_SclCountNonBufferLoadInt( SC_Man * p, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    float Load = 0;
    int i; 
    if ( !Abc_ObjIsBuffer(pObj) )
        return 0;
    Abc_ObjForEachFanout( pObj, pFanout, i )
        Load += Abc_SclCountNonBufferLoadInt( p, pFanout );
    Load += 0.5 * Abc_SclObjLoad(p, pObj)->rise + 0.5 * Abc_SclObjLoad(p, pObj)->fall;
    Load -= 0.5 * SC_CellPin(Abc_SclObjCell(pObj), 0)->rise_cap + 0.5 * SC_CellPin(Abc_SclObjCell(pObj), 0)->fall_cap;
    return Load;
}